

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::NewSlot(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,bool bstatic)

{
  byte bVar1;
  bool bVar2;
  SQChar *pSVar3;
  SQString *x;
  SQChar *pSVar4;
  int *in_RDX;
  SQSharedState *in_RSI;
  SQVM *in_RDI;
  byte in_R8B;
  SQObjectPtr oval;
  SQObjectPtr closure_1;
  SQObjectPtr res_1;
  SQObjectPtr closure;
  SQObjectPtr res;
  bool rawcall;
  SQObjectPtr *in_stack_ffffffffffffff38;
  SQObjectPtr *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  SQVM *in_stack_ffffffffffffff50;
  SQVM *this_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar5;
  int iVar6;
  SQVM *in_stack_ffffffffffffff68;
  SQObjectValue local_90;
  SQObjectPtr *in_stack_ffffffffffffff78;
  SQObjectPtr *in_stack_ffffffffffffff80;
  SQTable *in_stack_ffffffffffffff88;
  int local_64;
  undefined1 local_60 [32];
  byte local_2a;
  byte local_29;
  SQSharedState *local_18;
  byte local_1;
  
  local_29 = in_R8B & 1;
  if (((ulong)in_RSI->_alloc_ctx & 0x100000000) != 0) {
    pSVar3 = GetTypeName((SQObjectPtr *)0x16bdb1);
    Raise_Error(in_RDI,"trying to modify immutable \'%s\'",pSVar3);
    local_1 = 0;
    goto LAB_0016c2f7;
  }
  if (*in_RDX == 0x1000001) {
    Raise_Error(in_RDI,"null cannot be used as index");
    local_1 = 0;
    goto LAB_0016c2f7;
  }
  iVar6 = *(int *)&in_RSI->_alloc_ctx;
  local_18 = in_RSI;
  if (iVar6 == 0x8004000) {
    bVar2 = SQClass::NewSlot(res_1.super_SQObject._unVal.pClass,
                             (SQSharedState *)res_1.super_SQObject._0_8_,
                             (SQObjectPtr *)closure_1.super_SQObject._unVal.pTable,
                             (SQObjectPtr *)closure_1.super_SQObject._0_8_,
                             (bool)oval.super_SQObject._unVal.nInteger._7_1_);
    if (!bVar2) {
      bVar2 = SQClass::isLocked((SQClass *)local_18->_metamethodnames);
      if (bVar2) {
        Raise_Error(in_RDI,
                    "trying to modify a class that has already been instantiated, inherited or is locked manually"
                   );
        local_1 = 0;
      }
      else {
        x = PrintObjVal(in_stack_ffffffffffffff68,(SQObjectPtr *)in_RDI);
        ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff68,x);
        Raise_Error(in_RDI,"the property \'%s\' already exists",&(local_90.pTable)->_firstfree);
        local_1 = 0;
        ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff40);
      }
      goto LAB_0016c2f7;
    }
  }
  else if (iVar6 == 0xa000020) {
    local_2a = 1;
    if (in_RSI->_metamethodnames[2]._vals != (SQObjectPtr *)0x0) {
      this_00 = (SQVM *)&stack0xffffffffffffffc0;
      ::SQObjectPtr::SQObjectPtr(in_stack_ffffffffffffff40);
      bVar2 = SQTable::Get((SQTable *)CONCAT44(iVar6,in_stack_ffffffffffffff58),
                           (SQObjectPtr *)this_00,
                           (SQObjectPtr *)
                           CONCAT17(in_stack_ffffffffffffff4f,
                                    CONCAT16(in_stack_ffffffffffffff4e,
                                             CONCAT15(in_stack_ffffffffffffff4d,
                                                      CONCAT14(in_stack_ffffffffffffff4c,
                                                               in_stack_ffffffffffffff48)))));
      uVar5 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff58);
      if (bVar2) {
LAB_0016bfdc:
        bVar2 = false;
      }
      else {
        ::SQObjectPtr::SQObjectPtr(in_stack_ffffffffffffff40);
        if ((local_18->_metamethodnames[2]._vals == (SQObjectPtr *)0x0) ||
           (bVar1 = (**(code **)&local_18->_metamethodnames->_vals[3].super_SQObject)
                              (local_18->_metamethodnames,in_RDI,0xd,local_60), (bVar1 & 1) == 0)) {
          local_2a = 1;
LAB_0016bfbe:
          bVar2 = false;
        }
        else {
          Push(this_00,(SQObjectPtr *)
                       CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff4e,
                                               CONCAT15(in_stack_ffffffffffffff4d,
                                                        CONCAT14(in_stack_ffffffffffffff4c,
                                                                 in_stack_ffffffffffffff48)))));
          Push(this_00,(SQObjectPtr *)
                       CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff4e,
                                               CONCAT15(in_stack_ffffffffffffff4d,
                                                        CONCAT14(in_stack_ffffffffffffff4c,
                                                                 in_stack_ffffffffffffff48)))));
          Push(this_00,(SQObjectPtr *)
                       CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff4e,
                                               CONCAT15(in_stack_ffffffffffffff4d,
                                                        CONCAT14(in_stack_ffffffffffffff4c,
                                                                 in_stack_ffffffffffffff48)))));
          bVar2 = CallMetaMethod((SQVM *)CONCAT44(iVar6,uVar5),(SQObjectPtr *)this_00,
                                 CONCAT13(bVar1,CONCAT12(in_stack_ffffffffffffff4e,
                                                         CONCAT11(in_stack_ffffffffffffff4d,
                                                                  in_stack_ffffffffffffff4c))),
                                 (SQInteger)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          if (bVar2) {
            local_2a = 0;
            goto LAB_0016bfbe;
          }
          local_1 = 0;
          bVar2 = true;
        }
        ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff40);
        if (!bVar2) goto LAB_0016bfdc;
      }
      ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff40);
      if (bVar2) goto LAB_0016c2f7;
    }
    if ((local_2a & 1) != 0) {
      SQTable::NewSlot(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                      );
    }
  }
  else {
    if (iVar6 != 0xa008000) {
      pSVar3 = GetTypeName((SQObjectPtr *)0x16c2b8);
      pSVar4 = GetTypeName((SQObjectPtr *)0x16c2ca);
      Raise_Error(in_RDI,"indexing %s with %s",pSVar3,pSVar4);
      local_1 = 0;
      goto LAB_0016c2f7;
    }
    ::SQObjectPtr::SQObjectPtr(in_stack_ffffffffffffff40);
    ::SQObjectPtr::SQObjectPtr(in_stack_ffffffffffffff40);
    if ((local_18->_metamethodnames[2]._vals == (SQObjectPtr *)0x0) ||
       (bVar1 = (**(code **)&local_18->_metamethodnames->_vals[3].super_SQObject)
                          (local_18->_metamethodnames,in_RDI,0xd,&stack0xffffffffffffff78),
       (bVar1 & 1) == 0)) {
      Raise_Error(in_RDI,"class instances do not support the new slot operator");
      local_1 = 0;
      local_64 = 1;
    }
    else {
      Push(in_stack_ffffffffffffff50,
           (SQObjectPtr *)
           CONCAT17(in_stack_ffffffffffffff4f,
                    CONCAT16(in_stack_ffffffffffffff4e,
                             CONCAT15(bVar1,CONCAT14(in_stack_ffffffffffffff4c,
                                                     in_stack_ffffffffffffff48)))));
      Push(in_stack_ffffffffffffff50,
           (SQObjectPtr *)
           CONCAT17(in_stack_ffffffffffffff4f,
                    CONCAT16(in_stack_ffffffffffffff4e,
                             CONCAT15(bVar1,CONCAT14(in_stack_ffffffffffffff4c,
                                                     in_stack_ffffffffffffff48)))));
      Push(in_stack_ffffffffffffff50,
           (SQObjectPtr *)
           CONCAT17(in_stack_ffffffffffffff4f,
                    CONCAT16(in_stack_ffffffffffffff4e,
                             CONCAT15(bVar1,CONCAT14(in_stack_ffffffffffffff4c,
                                                     in_stack_ffffffffffffff48)))));
      bVar2 = CallMetaMethod((SQVM *)CONCAT44(iVar6,in_stack_ffffffffffffff58),
                             (SQObjectPtr *)in_stack_ffffffffffffff50,
                             CONCAT13(in_stack_ffffffffffffff4f,
                                      CONCAT12(in_stack_ffffffffffffff4e,
                                               CONCAT11(bVar1,in_stack_ffffffffffffff4c))),
                             (SQInteger)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if (bVar2) {
        local_64 = 2;
      }
      else {
        local_1 = 0;
        local_64 = 1;
      }
    }
    ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff40);
    ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff40);
    if (local_64 == 1) goto LAB_0016c2f7;
  }
  local_1 = 1;
LAB_0016c2f7:
  return (bool)(local_1 & 1);
}

Assistant:

bool SQVM::NewSlot(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,bool bstatic)
{
    if (self._flags & SQOBJ_FLAG_IMMUTABLE) {
        Raise_Error(_SC("trying to modify immutable '%s'"),GetTypeName(self));
        return false;
    }

    if(sq_type(key) == OT_NULL) { Raise_Error(_SC("null cannot be used as index")); return false; }
    switch(sq_type(self)) {
    case OT_TABLE: {
        bool rawcall = true;
        if(_table(self)->_delegate) {
            SQObjectPtr res;
            if(!_table(self)->Get(key,res)) {
                SQObjectPtr closure;
                if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_NEWSLOT,closure)) {
                    Push(self);Push(key);Push(val);
                    if(!CallMetaMethod(closure,MT_NEWSLOT,3,res)) {
                        return false;
                    }
                    rawcall = false;
                }
                else {
                    rawcall = true;
                }
            }
        }
        if(rawcall) _table(self)->NewSlot(key,val); //cannot fail

        break;}
    case OT_INSTANCE: {
        SQObjectPtr res;
        SQObjectPtr closure;
        if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_NEWSLOT,closure)) {
            Push(self);Push(key);Push(val);
            if(!CallMetaMethod(closure,MT_NEWSLOT,3,res)) {
                return false;
            }
            break;
        }
        Raise_Error(_SC("class instances do not support the new slot operator"));
        return false;
        break;}
    case OT_CLASS:
        if(!_class(self)->NewSlot(_ss(this),key,val,bstatic)) {
            if(_class(self)->isLocked()) {
                Raise_Error(_SC("trying to modify a class that has already been instantiated, inherited or is locked manually"));
                return false;
            }
            else {
                SQObjectPtr oval = PrintObjVal(key);
                Raise_Error(_SC("the property '%s' already exists"),_stringval(oval));
                return false;
            }
        }
        break;
    default:
        Raise_Error(_SC("indexing %s with %s"),GetTypeName(self),GetTypeName(key));
        return false;
        break;
    }
    return true;
}